

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tnt_io.c
# Opt level: O1

ssize_t tnt_io_sendv_raw(tnt_stream_net *s,iovec *iov,int count,int all)

{
  tnt_iob_txv_t p_Var1;
  ulong uVar2;
  bool bVar3;
  int iVar4;
  long lVar5;
  ulong uVar6;
  int *piVar7;
  ssize_t sVar8;
  int iVar9;
  long lVar10;
  
  lVar10 = 0;
  do {
    if (count < 1) goto LAB_001086eb;
    p_Var1 = (s->sbuf).txv;
    if (p_Var1 == (tnt_iob_txv_t)0x0) {
      do {
        uVar6 = writev(s->fd,(iovec *)iov,count);
        if (uVar6 != 0xffffffffffffffff) goto LAB_00108664;
        piVar7 = __errno_location();
      } while (*piVar7 == 4);
      uVar6 = 0xffffffffffffffff;
    }
    else {
      if (getiovmax::iovmax == -1) {
        lVar5 = sysconf(0x3c);
        getiovmax::iovmax = (int)lVar5;
        if (getiovmax::iovmax == -1) {
          getiovmax::iovmax = 1;
        }
      }
      iVar4 = count;
      if ((getiovmax::iovmax <= count) && (iVar4 = getiovmax::iovmax, getiovmax::iovmax == -1)) {
        lVar5 = sysconf(0x3c);
        iVar4 = (int)lVar5;
        getiovmax::iovmax = iVar4;
        if (iVar4 == -1) {
          iVar4 = 1;
          getiovmax::iovmax = iVar4;
        }
      }
      uVar6 = (*p_Var1)(&s->sbuf,iov,iVar4);
    }
LAB_00108664:
    if ((long)uVar6 < 1) {
      s->error = TNT_ESYSTEM;
      piVar7 = __errno_location();
      s->errno_ = *piVar7;
      iVar4 = 1;
    }
    else {
      lVar10 = lVar10 + uVar6;
      if (all == 0) {
        iVar4 = 3;
      }
      else {
        iVar9 = 1;
        if (count < 1) {
          iVar9 = count;
        }
        do {
          uVar2 = ((iovec *)iov)->iov_len;
          if (uVar6 <= uVar2 && uVar2 - uVar6 != 0) {
            ((iovec *)iov)->iov_base = (void *)((long)((iovec *)iov)->iov_base + uVar6);
            ((iovec *)iov)->iov_len = uVar2 - uVar6;
            iVar4 = 0;
            goto LAB_001086d7;
          }
          uVar6 = uVar6 - uVar2;
          iov = (iovec *)((iovec *)iov + 1);
          bVar3 = 1 < count;
          count = count + -1;
        } while (bVar3);
        iVar4 = 0;
        count = iVar9 + -1;
      }
    }
LAB_001086d7:
  } while (iVar4 == 0);
  sVar8 = -1;
  if (iVar4 == 3) {
LAB_001086eb:
    sVar8 = lVar10;
  }
  return sVar8;
}

Assistant:

ssize_t
tnt_io_sendv_raw(struct tnt_stream_net *s, struct iovec *iov, int count, int all)
{
	size_t total = 0;
	while (count > 0) {
		ssize_t r;
		if (s->sbuf.txv) {
			r = s->sbuf.txv(&s->sbuf, iov, MIN(count, getiovmax()));
		} else {
			do {
				r = writev(s->fd, iov, count);
			} while (r == -1 && (errno == EINTR));
		}
		if (r <= 0) {
			s->error = TNT_ESYSTEM;
			s->errno_ = errno;
			return -1;
		}
		total += r;
		if (!all)
			break;
		while (count > 0) {
			if (iov->iov_len > (size_t)r) {
				iov->iov_base += r;
				iov->iov_len -= r;
				break;
			} else {
				r -= iov->iov_len;
				iov++;
				count--;
			}
		}
	}
	return total;
}